

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

int gdLayerOverlay(int dst,int src)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = (uint)src >> 0x10 & 0xff;
  uVar1 = (uint)dst >> 0x10 & 0xff;
  if (uVar1 < 0x80) {
    uVar1 = (uVar1 * 2 * uVar2) / 0xff;
  }
  else {
    uVar1 = ((uVar1 + uVar2) * 2 - (uVar1 * 2 * uVar2) / 0xff) - 0xff;
  }
  uVar3 = (uint)src >> 8 & 0xff;
  uVar2 = (uint)dst >> 8 & 0xff;
  if (uVar2 < 0x80) {
    uVar2 = (uVar2 * 2 * uVar3) / 0xff;
  }
  else {
    uVar2 = ((uVar2 + uVar3) * 2 - (uVar2 * 2 * uVar3) / 0xff) - 0xff;
  }
  uVar4 = src & 0xff;
  uVar3 = dst & 0xff;
  if (uVar3 < 0x80) {
    uVar3 = (uVar3 * 2 * uVar4) / 0xff;
  }
  else {
    uVar3 = ((uVar3 + uVar4) * 2 - (uVar3 * 2 * uVar4) / 0xff) - 0xff;
  }
  return uVar3 + uVar2 * 0x100 + uVar1 * 0x10000 +
                 ((((uint)~src >> 0x18 & 0x7f) * ((uint)~dst >> 0x18 & 0x7f)) / 0x7f) * -0x1000000 +
         0x7f000000;
}

Assistant:

BGD_DECLARE(int) gdLayerOverlay (int dst, int src)
{
	int a1, a2;
	a1 = gdAlphaMax - gdTrueColorGetAlpha(dst);
	a2 = gdAlphaMax - gdTrueColorGetAlpha(src);
	return ( ((gdAlphaMax - a1*a2/gdAlphaMax) << 24) +
		(gdAlphaOverlayColor( gdTrueColorGetRed(src), gdTrueColorGetRed(dst), gdRedMax ) << 16) +
		(gdAlphaOverlayColor( gdTrueColorGetGreen(src), gdTrueColorGetGreen(dst), gdGreenMax ) << 8) +
		(gdAlphaOverlayColor( gdTrueColorGetBlue(src), gdTrueColorGetBlue(dst), gdBlueMax ))
		);
}